

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

void nni_msgq_run_notify(nni_msgq *mq)

{
  int iVar1;
  
  if (mq->mq_cap <= mq->mq_len) {
    iVar1 = nni_list_empty(&mq->mq_aio_getq);
    if (iVar1 != 0) {
      nni_pollable_clear(&mq->mq_sendable);
      goto LAB_001221d1;
    }
  }
  nni_pollable_raise(&mq->mq_sendable);
LAB_001221d1:
  if (mq->mq_len == 0) {
    iVar1 = nni_list_empty(&mq->mq_aio_putq);
    if (iVar1 != 0) {
      nni_pollable_clear(&mq->mq_recvable);
      return;
    }
  }
  nni_pollable_raise(&mq->mq_recvable);
  return;
}

Assistant:

static void
nni_msgq_run_notify(nni_msgq *mq)
{
	if (mq->mq_len < mq->mq_cap || !nni_list_empty(&mq->mq_aio_getq)) {
		nni_pollable_raise(&mq->mq_sendable);
	} else {
		nni_pollable_clear(&mq->mq_sendable);
	}
	if ((mq->mq_len != 0) || !nni_list_empty(&mq->mq_aio_putq)) {
		nni_pollable_raise(&mq->mq_recvable);
	} else {
		nni_pollable_clear(&mq->mq_recvable);
	}
}